

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelocDirWrapper.cpp
# Opt level: O2

QString * RelocEntryWrapper::translateType(QString *__return_storage_ptr__,WORD type)

{
  char *ch;
  
  if (type < 0xb) {
    ch = &DAT_00136758 + *(int *)(&DAT_00136758 + (ulong)type * 4);
  }
  else {
    ch = "";
  }
  QString::QString(__return_storage_ptr__,ch);
  return __return_storage_ptr__;
}

Assistant:

QString RelocEntryWrapper::translateType(WORD type)
{
    switch (type) {
        case 0 : return "Padding (skipped)";
        case 1 : return "High WORD of 32-bit field";
        case 2 : return "Low  WORD of 32-bit field";
        case 3 : return "32 bit field";
        case 4 : return "HighAdj";
        case 5 : return "MIPS JumpAddr";
        case 6 : case 7 : return "Reserved";
        case 9 : return "MIPS16 JumpAddr";
        case 10 : return "64 bit field";
    }
    return "";
}